

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

string * __thiscall
LTAircraft::GetFlightId_abi_cxx11_(string *__return_storage_ptr__,LTAircraft *this)

{
  FDStaticData stat;
  string in_stack_fffffffffffffe38;
  FDStaticData local_1a8;
  
  LTFlightData::WaitForSafeCopyStat(&local_1a8,this->fd);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe38,(string *)&(this->fd->acKey).key);
  LTFlightData::FDStaticData::acId(__return_storage_ptr__,&local_1a8,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  LTFlightData::FDStaticData::~FDStaticData(&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string LTAircraft::GetFlightId() const
{
    LTFlightData::FDStaticData stat = fd.WaitForSafeCopyStat();
    return stat.acId(key());
}